

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O1

void build_gamma_table(int gamma)

{
  long lVar1;
  uint8_t uVar3;
  long lVar2;
  long lVar4;
  long lVar5;
  long lVar6;
  
  gamma_table[0] = '\0';
  gamma_table[0xff] = 0xff;
  lVar4 = 1;
  do {
    lVar1 = (long)gamma_helper[lVar4] * (long)(gamma + -0x100);
    if (lVar1 == 0) {
      lVar1 = 0x100;
    }
    else {
      lVar5 = 0x10000;
      lVar6 = 0x200;
      do {
        lVar5 = lVar5 + lVar1;
        lVar2 = lVar1 + 0xff;
        if (-1 < lVar1) {
          lVar2 = lVar1;
        }
        lVar1 = ((lVar2 >> 8) * (long)gamma_helper[lVar4] * (long)(gamma + -0x100)) / lVar6;
        lVar6 = lVar6 + 0x100;
      } while (lVar1 != 0);
      lVar1 = lVar5 + 0xff;
      if (-1 < lVar5) {
        lVar1 = lVar5;
      }
      lVar1 = lVar1 >> 8;
    }
    lVar1 = lVar1 * lVar4;
    uVar3 = (uint8_t)((uint)((int)lVar1 + 0xff) >> 8);
    if (-1 < lVar1) {
      uVar3 = (uint8_t)((ulong)lVar1 >> 8);
    }
    gamma_table[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xff);
  return;
}

Assistant:

void build_gamma_table(int gamma)
{
	int i, n;

	/*
	 * value is the current sum.
	 * diff is the new term to add to the series.
	 */
	long value, diff;

	/* Hack - convergence is bad in these cases. */
	gamma_table[0] = 0;
	gamma_table[255] = 255;

	for (i = 1; i < 255; i++) {
		/*
		 * Initialise the Taylor series
		 *
		 * value and diff have been scaled by 256
		 */
		n = 1;
		value = 256L * 256L;
		diff = ((long)gamma_helper[i]) * (gamma - 256);

		while (diff) {
			value += diff;
			n++;

			/*
			 * Use the following identiy to calculate the gamma table.
			 * exp(x) = 1 + x + x^2/2 + x^3/(2*3) + x^4/(2*3*4) +...
			 *
			 * n is the current term number.
			 *
			 * The gamma_helper array contains a table of
			 * ln(x/256) * 256
			 * This is used because a^b = exp(b*ln(a))
			 *
			 * In this case:
			 * a is i / 256
			 * b is gamma.
			 *
			 * Note that everything is scaled by 256 for accuracy,
			 * plus another factor of 256 for the final result to
			 * be from 0-255.  Thus gamma_helper[] * gamma must be
			 * divided by 256*256 each itteration, to get back to
			 * the original power series.
			 */
			diff = (((diff / 256) * gamma_helper[i]) *
					(gamma - 256)) / (256 * n);
		}

		/*
		 * Store the value in the table so that the
		 * floating point pow function isn't needed.
		 */
		gamma_table[i] = (uint8_t)(((long)(value / 256) * i) / 256);
	}
}